

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdGetLastErrorCode_Test::cfdcapi_common_CfdGetLastErrorCode_Test
          (cfdcapi_common_CfdGetLastErrorCode_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__cfdcapi_common_CfdGetLastErrorCode_Test_009f1a60;
  return;
}

Assistant:

TEST(cfdcapi_common, CfdGetLastErrorCode) {
  int ret = CfdGetLastErrorCode(NULL);
  EXPECT_EQ(kCfdSuccess, ret);

  void* handle = NULL;
  ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  ret = CfdGetLastErrorCode(handle);
  EXPECT_EQ(kCfdSuccess, ret);

  cfd::capi::SetLastError(handle, kCfdOutOfRangeError, "dummy");
  ret = CfdGetLastErrorCode(handle);
  EXPECT_EQ(kCfdOutOfRangeError, ret);

  cfd::capi::SetLastFatalError(handle, "dummy");
  ret = CfdGetLastErrorCode(handle);
  EXPECT_EQ(kCfdUnknownError, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}